

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  bool bVar1;
  TestCase *pTVar2;
  reference ppTVar3;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar4;
  TestInfo *pTVar5;
  const_reference ppTVar6;
  char *pcVar7;
  TestInfo *test_info;
  size_t j;
  bool printed_test_case_name;
  TestCase *test_case;
  size_t i;
  int kMaxParamLength;
  UnitTestImpl *this_local;
  
  test_case = (TestCase *)0x0;
  while( true ) {
    pTVar2 = (TestCase *)
             std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                       (&this->test_cases_);
    if (pTVar2 <= test_case) break;
    ppTVar3 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        (&this->test_cases_,(size_type)test_case);
    pTVar2 = *ppTVar3;
    bVar1 = false;
    test_info = (TestInfo *)0x0;
    while( true ) {
      pvVar4 = TestCase::test_info_list(pTVar2);
      pTVar5 = (TestInfo *)
               std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar4);
      if (pTVar5 <= test_info) break;
      pvVar4 = TestCase::test_info_list(pTVar2);
      ppTVar6 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar4,(size_type)test_info);
      pTVar5 = *ppTVar6;
      if ((pTVar5->matches_filter_ & 1U) != 0) {
        if (!bVar1) {
          bVar1 = true;
          pcVar7 = TestCase::name(pTVar2);
          printf("%s.",pcVar7);
          pcVar7 = TestCase::type_param(pTVar2);
          if (pcVar7 != (char *)0x0) {
            printf("  # %s = ","TypeParam");
            pcVar7 = TestCase::type_param(pTVar2);
            PrintOnOneLine(pcVar7,0xfa);
          }
          printf("\n");
        }
        pcVar7 = TestInfo::name(pTVar5);
        printf("  %s",pcVar7);
        pcVar7 = TestInfo::value_param(pTVar5);
        if (pcVar7 != (char *)0x0) {
          printf("  # %s = ","GetParam()");
          pcVar7 = TestInfo::value_param(pTVar5);
          PrintOnOneLine(pcVar7,0xfa);
        }
        printf("\n");
      }
      test_info = (TestInfo *)&(test_info->test_case_name_).field_0x1;
    }
    test_case = (TestCase *)((long)&test_case->_vptr_TestCase + 1);
  }
  fflush(_stdout);
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (size_t i = 0; i < test_cases_.size(); i++) {
    const TestCase* const test_case = test_cases_[i];
    bool printed_test_case_name = false;

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      const TestInfo* const test_info =
          test_case->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_case_name) {
          printed_test_case_name = true;
          printf("%s.", test_case->name());
          if (test_case->type_param() != NULL) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_case->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != NULL) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
}